

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_code(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  undefined4 *puVar2;
  unsigned_long uVar3;
  uchar *inBuf;
  Value self;
  long *local_58;
  char local_50;
  undefined1 local_48 [16];
  Value local_38;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_28;
  anon_union_8_3_2f476f46_for_data local_20;
  
  local_50 = '\0';
  plVar1 = (long *)operator_new(0x30);
  plVar1[1] = 1;
  *plVar1 = (long)&PTR__StringStorage_001bf0d8;
  plVar1[3] = 5;
  plVar1[4] = -1;
  puVar2 = (undefined4 *)operator_new__(5);
  plVar1[2] = (long)puVar2;
  *(undefined1 *)(puVar2 + 1) = 0;
  *puVar2 = 0x666c6573;
  local_58 = plVar1;
  Context::GetVar((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar1 = local_58 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  if (local_48[0] == 0) {
    local_38.data.number = 0.0;
  }
  else {
    Value::ToString((Value *)&local_28,(Machine *)local_48);
    if (local_28 == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      inBuf = "";
    }
    else {
      inBuf = (uchar *)local_28->mSize;
    }
    uVar3 = UTF8Decode(inBuf);
    if ((local_28 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       ((bool)local_20.tempNum._0_1_ == false)) {
      plVar1 = &(local_28->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_28->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
    }
    local_38.data.number = (double)(long)uVar3;
  }
  local_38.type = Number;
  local_38.noInvoke = false;
  local_38.localOnly = Off;
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_38);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_38.type) && (local_38.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_38.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_38.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_38.data.number = 0.0;
  }
  if ((2 < local_48[0]) && ((long *)local_48._8_8_ != (long *)0x0)) {
    plVar1 = (long *)(local_48._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*(long *)local_48._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_code(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		long codepoint = 0;
		if (not self.IsNull()) codepoint = UTF8Decode((unsigned char*)(self.ToString().c_str()));
		return IntrinsicResult(codepoint);
	}